

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_string_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::StringFieldGenerator::GenerateInlineAccessorDefinitions
          (StringFieldGenerator *this,Printer *printer)

{
  char *pcVar1;
  Formatter format;
  Formatter local_48;
  
  local_48.printer_ = printer;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&local_48.vars_._M_t,&(this->super_FieldGenerator).variables_._M_t);
  Formatter::operator()<>
            (&local_48,
             "inline const std::string& $classname$::$name$() const {\n$annotate_accessor$  // @@protoc_insertion_point(field_get:$full_name$)\n  return _internal_$name$();\n}\ninline void $classname$::set_$name$(const std::string& value) {\n$annotate_accessor$  _internal_set_$name$(value);\n  // @@protoc_insertion_point(field_set:$full_name$)\n}\ninline std::string* $classname$::mutable_$name$() {\n$annotate_accessor$  // @@protoc_insertion_point(field_mutable:$full_name$)\n  return _internal_mutable_$name$();\n}\n"
            );
  if (*(char *)(*(long *)(*(long *)((this->super_FieldGenerator).descriptor_ + 0x28) + 0x88) + 0xa0)
      == '\x01') {
    Formatter::operator()<>
              (&local_48,
               "inline const std::string& $classname$::_internal_$name$() const {\n  return $name$_.Get();\n}\ninline void $classname$::_internal_set_$name$(const std::string& value) {\n  $set_hasbit$\n  $name$_.Set$lite$($default_variable$, value, GetArenaNoVirtual());\n}\ninline void $classname$::set_$name$(std::string&& value) {\n$annotate_accessor$  $set_hasbit$\n  $name$_.Set$lite$(\n    $default_variable$, ::std::move(value), GetArenaNoVirtual());\n  // @@protoc_insertion_point(field_set_rvalue:$full_name$)\n}\ninline void $classname$::set_$name$(const char* value) {\n$annotate_accessor$  $null_check$  $set_hasbit$\n  $name$_.Set$lite$($default_variable$, $string_piece$(value),\n              GetArenaNoVirtual());\n  // @@protoc_insertion_point(field_set_char:$full_name$)\n}\n"
              );
    if (((this->super_FieldGenerator).options_)->opensource_runtime == false) {
      Formatter::operator()<>
                (&local_48,
                 "inline void $classname$::set_$name$(::StringPiece value) {\n$annotate_accessor$  $set_hasbit$\n  $name$_.Set$lite$($default_variable$, value, GetArenaNoVirtual());\n  // @@protoc_insertion_point(field_set_string_piece:$full_name$)\n}\n"
                );
    }
    Formatter::operator()<>
              (&local_48,
               "inline void $classname$::set_$name$(const $pointer_type$* value,\n    size_t size) {\n$annotate_accessor$  $set_hasbit$\n  $name$_.Set$lite$($default_variable$, $string_piece$(\n      reinterpret_cast<const char*>(value), size), GetArenaNoVirtual());\n  // @@protoc_insertion_point(field_set_pointer:$full_name$)\n}\ninline std::string* $classname$::_internal_mutable_$name$() {\n  $set_hasbit$\n  return $name$_.Mutable($default_variable$, GetArenaNoVirtual());\n}\ninline std::string* $classname$::$release_name$() {\n$annotate_accessor$  // @@protoc_insertion_point(field_release:$full_name$)\n"
              );
    pcVar1 = 
    "  if (!has_$name$()) {\n    return nullptr;\n  }\n  $clear_hasbit$\n  return $name$_.ReleaseNonDefault($default_variable$, GetArenaNoVirtual());\n"
    ;
    if (*(int *)(*(long *)((this->super_FieldGenerator).descriptor_ + 0x28) + 0x3c) == 3) {
      pcVar1 = 
      "  $clear_hasbit$\n  return $name$_.Release($default_variable$, GetArenaNoVirtual());\n";
    }
    Formatter::operator()<>(&local_48,pcVar1);
    Formatter::operator()<>
              (&local_48,
               "}\ninline void $classname$::set_allocated_$name$(std::string* $name$) {\n$annotate_accessor$  if ($name$ != nullptr) {\n    $set_hasbit$\n  } else {\n    $clear_hasbit$\n  }\n  $name$_.SetAllocated($default_variable$, $name$,\n      GetArenaNoVirtual());\n  // @@protoc_insertion_point(field_set_allocated:$full_name$)\n}\n"
              );
    if (((this->super_FieldGenerator).options_)->opensource_runtime == false) goto LAB_002cb2f8;
    pcVar1 = 
    "inline std::string* $classname$::unsafe_arena_release_$name$() {\n$annotate_accessor$  // @@protoc_insertion_point(field_unsafe_arena_release:$full_name$)\n  $DCHK$(GetArenaNoVirtual() != nullptr);\n  $clear_hasbit$\n  return $name$_.UnsafeArenaRelease($default_variable$,\n      GetArenaNoVirtual());\n}\ninline void $classname$::unsafe_arena_set_allocated_$name$(\n$annotate_accessor$    std::string* $name$) {\n  $DCHK$(GetArenaNoVirtual() != nullptr);\n  if ($name$ != nullptr) {\n    $set_hasbit$\n  } else {\n    $clear_hasbit$\n  }\n  $name$_.UnsafeArenaSetAllocated($default_variable$,\n      $name$, GetArenaNoVirtual());\n  // @@protoc_insertion_point(field_unsafe_arena_set_allocated:$full_name$)\n}\n"
    ;
  }
  else {
    Formatter::operator()<>
              (&local_48,
               "inline const std::string& $classname$::_internal_$name$() const {\n  return $name$_.GetNoArena();\n}\ninline void $classname$::_internal_set_$name$(const std::string& value) {\n  $set_hasbit$\n  $name$_.SetNoArena($default_variable$, value);\n}\ninline void $classname$::set_$name$(std::string&& value) {\n$annotate_accessor$  $set_hasbit$\n  $name$_.SetNoArena(\n    $default_variable$, ::std::move(value));\n  // @@protoc_insertion_point(field_set_rvalue:$full_name$)\n}\ninline void $classname$::set_$name$(const char* value) {\n$annotate_accessor$  $null_check$  $set_hasbit$\n  $name$_.SetNoArena($default_variable$, $string_piece$(value));\n  // @@protoc_insertion_point(field_set_char:$full_name$)\n}\n"
              );
    if (((this->super_FieldGenerator).options_)->opensource_runtime == false) {
      Formatter::operator()<>
                (&local_48,
                 "inline void $classname$::set_$name$(::StringPiece value) {\n$annotate_accessor$  $set_hasbit$\n  $name$_.SetNoArena($default_variable$, value);\n  // @@protoc_insertion_point(field_set_string_piece:$full_name$)\n}\n"
                );
    }
    Formatter::operator()<>
              (&local_48,
               "inline void $classname$::set_$name$(const $pointer_type$* value, size_t size) {\n$annotate_accessor$  $set_hasbit$\n  $name$_.SetNoArena($default_variable$,\n      $string_piece$(reinterpret_cast<const char*>(value), size));\n  // @@protoc_insertion_point(field_set_pointer:$full_name$)\n}\ninline std::string* $classname$::_internal_mutable_$name$() {\n  $set_hasbit$\n  return $name$_.MutableNoArena($default_variable$);\n}\ninline std::string* $classname$::$release_name$() {\n$annotate_accessor$  // @@protoc_insertion_point(field_release:$full_name$)\n"
              );
    pcVar1 = 
    "  if (!has_$name$()) {\n    return nullptr;\n  }\n  $clear_hasbit$\n  return $name$_.ReleaseNonDefaultNoArena($default_variable$);\n"
    ;
    if (*(int *)(*(long *)((this->super_FieldGenerator).descriptor_ + 0x28) + 0x3c) == 3) {
      pcVar1 = "  $clear_hasbit$\n  return $name$_.ReleaseNoArena($default_variable$);\n";
    }
    Formatter::operator()<>(&local_48,pcVar1);
    pcVar1 = 
    "}\ninline void $classname$::set_allocated_$name$(std::string* $name$) {\n$annotate_accessor$  if ($name$ != nullptr) {\n    $set_hasbit$\n  } else {\n    $clear_hasbit$\n  }\n  $name$_.SetAllocatedNoArena($default_variable$, $name$);\n  // @@protoc_insertion_point(field_set_allocated:$full_name$)\n}\n"
    ;
  }
  Formatter::operator()<>(&local_48,pcVar1);
LAB_002cb2f8:
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_48.vars_._M_t);
  return;
}

Assistant:

void StringFieldGenerator::GenerateInlineAccessorDefinitions(
    io::Printer* printer) const {
  Formatter format(printer, variables_);
  format(
      "inline const std::string& $classname$::$name$() const {\n"
      "$annotate_accessor$"
      "  // @@protoc_insertion_point(field_get:$full_name$)\n"
      "  return _internal_$name$();\n"
      "}\n"
      "inline void $classname$::set_$name$(const std::string& value) {\n"
      "$annotate_accessor$"
      "  _internal_set_$name$(value);\n"
      "  // @@protoc_insertion_point(field_set:$full_name$)\n"
      "}\n"
      "inline std::string* $classname$::mutable_$name$() {\n"
      "$annotate_accessor$"
      "  // @@protoc_insertion_point(field_mutable:$full_name$)\n"
      "  return _internal_mutable_$name$();\n"
      "}\n");
  if (SupportsArenas(descriptor_)) {
    format(
        "inline const std::string& $classname$::_internal_$name$() const {\n"
        "  return $name$_.Get();\n"
        "}\n"
        "inline void $classname$::_internal_set_$name$(const std::string& "
        "value) {\n"
        "  $set_hasbit$\n"
        "  $name$_.Set$lite$($default_variable$, value, GetArenaNoVirtual());\n"
        "}\n"
        "inline void $classname$::set_$name$(std::string&& value) {\n"
        "$annotate_accessor$"
        "  $set_hasbit$\n"
        "  $name$_.Set$lite$(\n"
        "    $default_variable$, ::std::move(value), GetArenaNoVirtual());\n"
        "  // @@protoc_insertion_point(field_set_rvalue:$full_name$)\n"
        "}\n"
        "inline void $classname$::set_$name$(const char* value) {\n"
        "$annotate_accessor$"
        "  $null_check$"
        "  $set_hasbit$\n"
        "  $name$_.Set$lite$($default_variable$, $string_piece$(value),\n"
        "              GetArenaNoVirtual());\n"
        "  // @@protoc_insertion_point(field_set_char:$full_name$)\n"
        "}\n");
    if (!options_.opensource_runtime) {
      format(
          "inline void $classname$::set_$name$(::StringPiece value) {\n"
          "$annotate_accessor$"
          "  $set_hasbit$\n"
          "  $name$_.Set$lite$($default_variable$, value, "
          "GetArenaNoVirtual());\n"
          "  // @@protoc_insertion_point(field_set_string_piece:$full_name$)\n"
          "}\n");
    }
    format(
        "inline "
        "void $classname$::set_$name$(const $pointer_type$* value,\n"
        "    size_t size) {\n"
        "$annotate_accessor$"
        "  $set_hasbit$\n"
        "  $name$_.Set$lite$($default_variable$, $string_piece$(\n"
        "      reinterpret_cast<const char*>(value), size), "
        "GetArenaNoVirtual());\n"
        "  // @@protoc_insertion_point(field_set_pointer:$full_name$)\n"
        "}\n"
        "inline std::string* $classname$::_internal_mutable_$name$() {\n"
        "  $set_hasbit$\n"
        "  return $name$_.Mutable($default_variable$, GetArenaNoVirtual());\n"
        "}\n"
        "inline std::string* $classname$::$release_name$() {\n"
        "$annotate_accessor$"
        "  // @@protoc_insertion_point(field_release:$full_name$)\n");

    if (HasFieldPresence(descriptor_->file())) {
      format(
          "  if (!has_$name$()) {\n"
          "    return nullptr;\n"
          "  }\n"
          "  $clear_hasbit$\n"
          "  return $name$_.ReleaseNonDefault("
          "$default_variable$, GetArenaNoVirtual());\n");
    } else {
      format(
          "  $clear_hasbit$\n"
          "  return $name$_.Release($default_variable$, "
          "GetArenaNoVirtual());\n");
    }

    format(
        "}\n"
        "inline void $classname$::set_allocated_$name$(std::string* $name$) {\n"
        "$annotate_accessor$"
        "  if ($name$ != nullptr) {\n"
        "    $set_hasbit$\n"
        "  } else {\n"
        "    $clear_hasbit$\n"
        "  }\n"
        "  $name$_.SetAllocated($default_variable$, $name$,\n"
        "      GetArenaNoVirtual());\n"
        "  // @@protoc_insertion_point(field_set_allocated:$full_name$)\n"
        "}\n");
    if (options_.opensource_runtime) {
      format(
          "inline std::string* $classname$::unsafe_arena_release_$name$() {\n"
          "$annotate_accessor$"
          "  // "
          "@@protoc_insertion_point(field_unsafe_arena_release:$full_name$)\n"
          "  $DCHK$(GetArenaNoVirtual() != nullptr);\n"
          "  $clear_hasbit$\n"
          "  return $name$_.UnsafeArenaRelease($default_variable$,\n"
          "      GetArenaNoVirtual());\n"
          "}\n"
          "inline void $classname$::unsafe_arena_set_allocated_$name$(\n"
          "$annotate_accessor$"
          "    std::string* $name$) {\n"
          "  $DCHK$(GetArenaNoVirtual() != nullptr);\n"
          "  if ($name$ != nullptr) {\n"
          "    $set_hasbit$\n"
          "  } else {\n"
          "    $clear_hasbit$\n"
          "  }\n"
          "  $name$_.UnsafeArenaSetAllocated($default_variable$,\n"
          "      $name$, GetArenaNoVirtual());\n"
          "  // @@protoc_insertion_point(field_unsafe_arena_set_allocated:"
          "$full_name$)\n"
          "}\n");
    }
  } else {
    // No-arena case.
    format(
        "inline const std::string& $classname$::_internal_$name$() const {\n"
        "  return $name$_.GetNoArena();\n"
        "}\n"
        "inline void $classname$::_internal_set_$name$(const std::string& "
        "value) {\n"
        "  $set_hasbit$\n"
        "  $name$_.SetNoArena($default_variable$, value);\n"
        "}\n"
        "inline void $classname$::set_$name$(std::string&& value) {\n"
        "$annotate_accessor$"
        "  $set_hasbit$\n"
        "  $name$_.SetNoArena(\n"
        "    $default_variable$, ::std::move(value));\n"
        "  // @@protoc_insertion_point(field_set_rvalue:$full_name$)\n"
        "}\n"
        "inline void $classname$::set_$name$(const char* value) {\n"
        "$annotate_accessor$"
        "  $null_check$"
        "  $set_hasbit$\n"
        "  $name$_.SetNoArena($default_variable$, $string_piece$(value));\n"
        "  // @@protoc_insertion_point(field_set_char:$full_name$)\n"
        "}\n");
    if (!options_.opensource_runtime) {
      format(
          "inline void $classname$::set_$name$(::StringPiece value) {\n"
          "$annotate_accessor$"
          "  $set_hasbit$\n"
          "  $name$_.SetNoArena($default_variable$, value);\n"
          "  // @@protoc_insertion_point(field_set_string_piece:$full_name$)\n"
          "}\n");
    }
    format(
        "inline "
        "void $classname$::set_$name$(const $pointer_type$* value, "
        "size_t size) {\n"
        "$annotate_accessor$"
        "  $set_hasbit$\n"
        "  $name$_.SetNoArena($default_variable$,\n"
        "      $string_piece$(reinterpret_cast<const char*>(value), size));\n"
        "  // @@protoc_insertion_point(field_set_pointer:$full_name$)\n"
        "}\n"
        "inline std::string* $classname$::_internal_mutable_$name$() {\n"
        "  $set_hasbit$\n"
        "  return $name$_.MutableNoArena($default_variable$);\n"
        "}\n"
        "inline std::string* $classname$::$release_name$() {\n"
        "$annotate_accessor$"
        "  // @@protoc_insertion_point(field_release:$full_name$)\n");

    if (HasFieldPresence(descriptor_->file())) {
      format(
          "  if (!has_$name$()) {\n"
          "    return nullptr;\n"
          "  }\n"
          "  $clear_hasbit$\n"
          "  return $name$_.ReleaseNonDefaultNoArena($default_variable$);\n");
    } else {
      format(
          "  $clear_hasbit$\n"
          "  return $name$_.ReleaseNoArena($default_variable$);\n");
    }

    format(
        "}\n"
        "inline void $classname$::set_allocated_$name$(std::string* $name$) {\n"
        "$annotate_accessor$"
        "  if ($name$ != nullptr) {\n"
        "    $set_hasbit$\n"
        "  } else {\n"
        "    $clear_hasbit$\n"
        "  }\n"
        "  $name$_.SetAllocatedNoArena($default_variable$, $name$);\n"
        "  // @@protoc_insertion_point(field_set_allocated:$full_name$)\n"
        "}\n");
  }
}